

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O0

void __thiscall sophia_interface::LUPREP_checkFlavour(sophia_interface *this,int IP)

{
  int *piVar1;
  double dVar2;
  double dVar3;
  __type _Var4;
  double dVar5;
  double dVar6;
  int local_c0;
  allocator local_b9;
  int J_1;
  allocator local_81;
  string local_80 [32];
  int local_60;
  int local_5c;
  int J;
  int KQ;
  int sgn;
  int KC;
  double dStack_48;
  int I;
  double DPS [5];
  int KQS;
  int KFN;
  int NP;
  int IP_local;
  sophia_interface *this_local;
  
  KQS = 0;
  DPS[4]._4_4_ = 0;
  DPS[4]._0_4_ = 0;
  KFN = IP;
  _NP = this;
  memset(&stack0xffffffffffffffb8,0,0x28);
  sgn = 1;
  piVar1 = std::max<int>(&sgn,&KFN);
  for (KC = *piVar1 + -1; KC < this->N; KC = KC + 1) {
    if (((0 < this->K[0][KC]) && (this->K[0][KC] < 0xb)) &&
       (KQ = LUCOMP(this,this->K[1][KC]), KQ != 0)) {
      J = 1;
      if (this->K[1][KC] < 0) {
        J = -1;
      }
      local_5c = KCHG[1][KQ + -1] * J;
      if (local_5c != 0) {
        KQS = KQS + 1;
        if (local_5c != 2) {
          DPS[4]._4_4_ = DPS[4]._4_4_ + 1;
          DPS[4]._0_4_ = local_5c + DPS[4]._0_4_;
          MSTJ[0x5c] = 1;
          dVar2 = ULMASS(this,this->K[1][KC]);
          DPS[3] = dVar2 + DPS[3];
        }
        for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
          DPS[(long)local_60 + -1] = this->P[local_60][KC] + DPS[(long)local_60 + -1];
        }
        if (this->K[0][KC] == 1) {
          if ((KQS != 1) && (((DPS[4]._4_4_ == 1 || (2 < DPS[4]._4_4_)) || (DPS[4]._0_4_ != 0)))) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_80,"LUPREP: unphysical flavour combination",&local_81);
            LUERRM(this,2,(string *)local_80);
            std::__cxx11::string::~string(local_80);
            std::allocator<char>::~allocator((allocator<char> *)&local_81);
          }
          if ((KQS != 1) &&
             (dVar5 = dStack_48 * dStack_48, dVar2 = DPS[2] * DPS[2], dVar6 = -DPS[0] * DPS[0],
             dVar3 = -DPS[1] * DPS[1], _Var4 = std::pow<double,int>(PARJ[0x1f] * 0.9 + DPS[3],2),
             dVar3 + dVar6 + dVar2 + -dVar5 < _Var4)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&J_1,"LUPREP: too small mass in jet system",&local_b9);
            LUERRM(this,3,(string *)&J_1);
            std::__cxx11::string::~string((string *)&J_1);
            std::allocator<char>::~allocator((allocator<char> *)&local_b9);
          }
          KQS = 0;
          DPS[4]._4_4_ = 0;
          DPS[4]._0_4_ = 0;
          for (local_c0 = 0; local_c0 < 5; local_c0 = local_c0 + 1) {
            DPS[(long)local_c0 + -1] = 0.0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void sophia_interface::LUPREP_checkFlavour(int IP) {
// Serves as a local function of LUPREP. Solves goto->320 statement.
// When this function is called, LUPREP returns.
    // Check flavours and invariant masses in parton systems.
    int NP = 0;
    int KFN = 0;
    int KQS = 0;
    double DPS[5] = {0., 0., 0., 0., 0.};
    for (int I = std::max(1, IP) - 1; I < N; ++I) {
        if (K[0][I] <= 0 || K[0][I] > 10) continue;
        int KC = LUCOMP(K[1][I]);
        if (KC == 0) continue;
        int sgn = (K[1][I] < 0)? -1 : 1;
        int KQ = KCHG[1][KC - 1] * sgn;
        if (KQ == 0) continue;
        NP++;
        if (KQ != 2) {
            KFN++;
            KQS += KQ;
            MSTJ[92] = 1;
            DPS[4] += ULMASS(K[1][I]);
        }
        for (int J = 0; J < 4; ++J) {
            DPS[J] += P[J][I];
        }
        if (K[0][I] == 1) {
            if (NP != 1 && (KFN == 1 || KFN >= 3 || KQS != 0)) LUERRM(2, "LUPREP: unphysical flavour combination");
            if (NP != 1 && DPS[3] * DPS[3] - DPS[0] * DPS[0] - DPS[1] * DPS[1] - DPS[2] * DPS[2] < std::pow(0.9 * PARJ[31] + DPS[4], 2)) LUERRM(3, "LUPREP: too small mass in jet system");
            NP = 0;
            KFN = 0;
            KQS = 0;
            for (int J = 0; J < 5; ++J) {
                DPS[J] = 0.;
            }
        }
    }
    return;
}